

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O0

string * GetDeepThoughtData_abi_cxx11_(string *__return_storage_ptr__,Data *data)

{
  int iVar1;
  uchar *puVar2;
  long lVar3;
  allocator local_51;
  string local_50 [48];
  int local_20;
  undefined1 local_19;
  int offset;
  Data *data_local;
  string *str;
  
  local_19 = 0;
  _offset = &data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  data_local = (Data *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = GetDeepThoughtDataOffset((Data *)_offset);
  if (local_20 != 0) {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(_offset);
    lVar3 = (long)local_20;
    iVar1 = Data::size((Data *)_offset);
    iVar1 = iVar1 - local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)(puVar2 + lVar3),(long)iVar1,&local_51);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetDeepThoughtData(const Data& data)
{
    std::string str;

    auto offset = GetDeepThoughtDataOffset(data);
    if (offset != 0)
        str = std::string(reinterpret_cast<const char*>(data.data() + offset), data.size() - offset);

    return str;
}